

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

void __thiscall ConvexDecomposition::cbtHullTriangle::~cbtHullTriangle(cbtHullTriangle *this)

{
  long lVar1;
  
  lVar1 = (long)this->id;
  if ((-1 < lVar1) && (this->id < DAT_00b98040)) {
    if (*(cbtHullTriangle **)(tris + lVar1 * 8) == this) {
      *(undefined8 *)(tris + lVar1 * 8) = 0;
      return;
    }
    __assert_fail("tris[id]==this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x931,"ConvexDecomposition::cbtHullTriangle::~cbtHullTriangle()");
  }
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::cbtHullTriangle *>::operator[](int) [Type = ConvexDecomposition::cbtHullTriangle *]"
               );
}

Assistant:

~cbtHullTriangle()
	{
		assert(tris[id]==this);
		tris[id]=NULL;
	}